

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::lowerEqZInt64(I64ToI32Lowering *this,Unary *curr)

{
  Builder *this_00;
  Expression *left;
  Index index;
  LocalGet *right;
  Binary *value;
  Unary *expression;
  undefined1 local_48 [8];
  TempVar highBits;
  
  fetchOutParam((TempVar *)local_48,this,curr->value);
  this_00 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  left = curr->value;
  index = TempVar::operator_cast_to_unsigned_int((TempVar *)local_48);
  right = Builder::makeLocalGet(this_00,index,(Type)0x2);
  value = Builder::makeBinary(this_00,OrInt32,left,(Expression *)right);
  expression = Builder::makeUnary(this_00,EqZInt32,(Expression *)value);
  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
              .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
             (Expression *)expression);
  TempVar::~TempVar((TempVar *)local_48);
  return;
}

Assistant:

void lowerEqZInt64(Unary* curr) {
    TempVar highBits = fetchOutParam(curr->value);

    auto* result = builder->makeUnary(
      EqZInt32,
      builder->makeBinary(
        OrInt32, curr->value, builder->makeLocalGet(highBits, Type::i32)));

    replaceCurrent(result);
  }